

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

Expr str_remove(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args
               ,int argc)

{
  _Bool _Var1;
  size_t index;
  size_t len;
  pString value;
  char *__s;
  Expr EVar2;
  Expr EVar3;
  Expr EVar4;
  Expr expr;
  Expr ptr;
  Expr ptr_00;
  Expr ptr_01;
  Expr expr_00;
  
  hlp_check_args_count(argc,3,3,"__str-remove");
  EVar2._4_4_ = 0;
  EVar2.type = args->type;
  EVar2.field_1.val_atom = (args->field_1).val_atom;
  EVar2 = exec_eval(exec,callContext,EVar2);
  ptr._4_4_ = 0;
  ptr.type = EVar2.type;
  ptr.field_1.val_atom = EVar2.field_1.val_atom;
  EVar2 = dereference(ptr);
  EVar3._4_4_ = 0;
  EVar3.type = args[1].type;
  EVar3.field_1.val_atom = args[1].field_1.val_atom;
  EVar3 = exec_eval(exec,callContext,EVar3);
  ptr_00._4_4_ = 0;
  ptr_00.type = EVar3.type;
  ptr_00.field_1.val_atom = EVar3.field_1.val_atom;
  EVar3 = dereference(ptr_00);
  index = longint_to_long(EVar3.field_1.val_int);
  expr._4_4_ = 0;
  expr.type = args[2].type;
  expr.field_1.val_atom = args[2].field_1.val_atom;
  EVar3 = exec_eval(exec,callContext,expr);
  ptr_01._4_4_ = 0;
  ptr_01.type = EVar3.type;
  ptr_01.field_1.val_atom = EVar3.field_1.val_atom;
  EVar3 = dereference(ptr_01);
  len = longint_to_long(EVar3.field_1.val_int);
  value = string_remove(EVar2.field_1.val_str,index,len);
  if (value == (pString)0x0) {
    __s = "__str-remove: string_remove failed";
  }
  else {
    EVar2 = make_string(exec,value);
    EVar4.field_1 = EVar2.field_1;
    EVar4.type = EVar2.type;
    free_string(value);
    expr_00._4_4_ = 0;
    expr_00.type = EVar4.type;
    expr_00.field_1.val_atom = EVar4.field_1.val_atom;
    _Var1 = is_none(expr_00);
    if (!_Var1) {
      EVar4._4_4_ = 0;
      return EVar4;
    }
    __s = "__str-remove: make_string failed";
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_remove)
{
    hlp_check_args_count(argc, 3, 3, "__str-remove");

    pString str = dereference(EVAL_ARG(0)).val_str;
    size_t start = (size_t) longint_to_long(dereference(EVAL_ARG(1)).val_int);
    size_t len = (size_t) longint_to_long(dereference(EVAL_ARG(2)).val_int);

    pString res_str = string_remove(str, start, len);
    if (res_str == NULL)
    {
        log("__str-remove: string_remove failed");
        exit(1);
    }

    Expr res = make_string(exec, res_str);
    free_string(res_str);
    if (is_none(res))
    {
        log("__str-remove: make_string failed");
        exit(1);
    }
    return res;
}